

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

bool __thiscall re2::Compiler::IsCachedRuneByteSuffix(Compiler *this,int id)

{
  Inst *this_00;
  byte bVar1;
  byte bVar2;
  int iVar3;
  iterator iVar4;
  uint64 key;
  ulong local_28;
  
  this_00 = this->inst_ + id;
  bVar1 = (this_00->field_1).field_3.lo_;
  bVar2 = (this_00->field_1).field_3.hi_;
  iVar3 = Prog::Inst::foldcase(this_00);
  local_28 = (ulong)(iVar3 != 0) |
             ((ulong)bVar1 << 9 | (ulong)(this->inst_[id].out_opcode_ >> 4) << 0x11) +
             (ulong)bVar2 * 2;
  iVar4 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::_Select1st<std::pair<const_unsigned_long,_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
          ::find(&(this->rune_cache_)._M_t,&local_28);
  return (_Rb_tree_header *)iVar4._M_node != &(this->rune_cache_)._M_t._M_impl.super__Rb_tree_header
  ;
}

Assistant:

bool Compiler::IsCachedRuneByteSuffix(int id) {
  uint8 lo = inst_[id].lo_;
  uint8 hi = inst_[id].hi_;
  bool foldcase = inst_[id].foldcase() != 0;
  int next = inst_[id].out();

  uint64 key = MakeRuneCacheKey(lo, hi, foldcase, next);
  return rune_cache_.find(key) != rune_cache_.end();
}